

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

int __thiscall QtMWidgets::TableViewCellLayout::heightForWidth(TableViewCellLayout *this,int w)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int extraout_var;
  int extraout_var_00;
  int iVar4;
  int iVar5;
  int local_38;
  
  uVar2 = (**(code **)(*(long *)this->imageLabel + 0x70))();
  uVar3 = (**(code **)(*(long *)this->accessoryWidget + 0x70))();
  QLayout::contentsMargins();
  iVar5 = (w - (int)uVar3) - (int)uVar2;
  iVar1 = 10;
  if (10 < iVar5) {
    iVar1 = iVar5;
  }
  iVar5 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,iVar1);
  iVar1 = (**(code **)(*(long *)this->detailedTextLabel + 0x80))(this->detailedTextLabel,iVar1);
  iVar4 = extraout_var_00 + extraout_var;
  iVar1 = iVar1 + iVar5 + iVar4;
  iVar5 = (int)((ulong)uVar2 >> 0x20) + iVar4;
  if (iVar1 <= iVar5) {
    iVar1 = iVar5;
  }
  local_38 = (int)((ulong)uVar3 >> 0x20);
  if (iVar1 <= iVar4 + local_38) {
    iVar1 = iVar4 + local_38;
  }
  return iVar1;
}

Assistant:

int
TableViewCellLayout::heightForWidth( int w ) const
{
	const QSize imageSize = imageLabel->sizeHint();
	const QSize accessorySize = accessoryWidget->sizeHint();
	const QMargins m = contentsMargins();

	const int textWidth = qMax( 10,
		w - imageSize.width() - accessorySize.width() );

	int height = textLabel->heightForWidth( textWidth ) +
		detailedTextLabel->heightForWidth( textWidth ) + m.top() + m.bottom();

	height = qMax( height, imageSize.height() + m.top() + m.bottom() );
	height = qMax( height, accessorySize.height() + m.top() + m.bottom() );

	return height;
}